

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_DriverCallback::OnPhaseChange
          (RS_DriverCallback *this,Phase old_phase,Phase new_phase)

{
  ChVector<double> *pCVar1;
  ChVector<double> *this_00;
  ChVector<double> *this_01;
  ChVector<double> *this_02;
  ostream *poVar2;
  double *pdVar3;
  ChSystem *this_03;
  double dVar4;
  ChVector<double> *rr;
  ChVector<double> *rl;
  ChVector<double> *fr;
  ChVector<double> *fl;
  Phase new_phase_local;
  Phase old_phase_local;
  RS_DriverCallback *this_local;
  
  if (new_phase == HOLD) {
    pCVar1 = RoboSimian::GetWheelPos(this->m_robot,FL);
    this_00 = RoboSimian::GetWheelPos(this->m_robot,FR);
    this_01 = RoboSimian::GetWheelPos(this->m_robot,RL);
    this_02 = RoboSimian::GetWheelPos(this->m_robot,RR);
    poVar2 = std::operator<<((ostream *)&std::cout,"  wheel FL: ");
    pdVar3 = ChVector<double>::x(pCVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    poVar2 = std::operator<<(poVar2,"  ");
    pdVar3 = ChVector<double>::y(pCVar1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"  wheel FR: ");
    pdVar3 = ChVector<double>::x(this_00);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    poVar2 = std::operator<<(poVar2,"  ");
    pdVar3 = ChVector<double>::y(this_00);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"  wheel RL: ");
    pdVar3 = ChVector<double>::x(this_01);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    poVar2 = std::operator<<(poVar2,"  ");
    pdVar3 = ChVector<double>::y(this_01);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"  wheel RR: ");
    pdVar3 = ChVector<double>::x(this_02);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    poVar2 = std::operator<<(poVar2,"  ");
    pdVar3 = ChVector<double>::y(this_02);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pdVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((new_phase == CYCLE) && (old_phase != CYCLE)) {
    pCVar1 = RoboSimian::GetChassisPos(this->m_robot);
    pdVar3 = ChVector<double>::x(pCVar1);
    this->m_start_x = *pdVar3;
    this_03 = RoboSimian::GetSystem(this->m_robot);
    dVar4 = ChSystem::GetChTime(this_03);
    this->m_start_time = dVar4;
  }
  return;
}

Assistant:

void RS_DriverCallback::OnPhaseChange(RS_Driver::Phase old_phase, RS_Driver::Phase new_phase) {
    if (new_phase == RS_Driver::HOLD) {
        auto& fl = m_robot->GetWheelPos(FL);
        auto& fr = m_robot->GetWheelPos(FR);
        auto& rl = m_robot->GetWheelPos(RL);
        auto& rr = m_robot->GetWheelPos(RR);
        std::cout << "  wheel FL: " << fl.x() << "  " << fl.y() << std::endl;
        std::cout << "  wheel FR: " << fr.x() << "  " << fr.y() << std::endl;
        std::cout << "  wheel RL: " << rl.x() << "  " << rl.y() << std::endl;
        std::cout << "  wheel RR: " << rr.x() << "  " << rr.y() << std::endl;
    }
    if (new_phase == RS_Driver::CYCLE && old_phase != RS_Driver::CYCLE) {
        m_start_x = m_robot->GetChassisPos().x();
        m_start_time = m_robot->GetSystem()->GetChTime();
    }
}